

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O3

bool tcmalloc::anon_unknown_0::ExtractUntilChar(char *text,int c,char **endptr)

{
  int iVar1;
  char *pcVar2;
  
  if (text == (char *)0x0) {
    _GLOBAL__N_1::ExtractUntilChar();
  }
  else if (endptr != (char **)0x0) {
    pcVar2 = strchr(text,c);
    if (pcVar2 == (char *)0x0) {
      *endptr = (char *)0x0;
    }
    else {
      *endptr = pcVar2;
      *pcVar2 = '\0';
    }
    return pcVar2 != (char *)0x0;
  }
  _GLOBAL__N_1::ExtractUntilChar();
  iVar1 = isspace(c);
  if (iVar1 != 0) {
    pcVar2 = *(char **)text;
    iVar1 = isspace((int)*pcVar2);
    while (iVar1 != 0) {
      pcVar2 = pcVar2 + 1;
      iVar1 = isspace((int)*pcVar2);
      if (iVar1 == 0) break;
      *(char **)text = pcVar2;
      iVar1 = isspace((int)*pcVar2);
    }
  }
  return SUB41(iVar1,0);
}

Assistant:

bool ExtractUntilChar(char *text, int c, char **endptr) {
  CHECK_NE(text, nullptr);
  CHECK_NE(endptr, nullptr);
  char *found;
  found = strchr(text, c);
  if (found == nullptr) {
    *endptr = nullptr;
    return false;
  }

  *endptr = found;
  *found = '\0';
  return true;
}